

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O1

void dirOPT(void)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  byte bVar7;
  long lVar8;
  vector<char_*,_std::allocator<char_*>_> parsedOptsArray;
  char parsedOpts [2048];
  char *local_860;
  char **local_858;
  long lStack_850;
  long local_848;
  char acStack_838 [2056];
  
  bVar7 = DAT_0018d50c;
  iVar4 = SkipBlanks(&lp);
  if (iVar4 == 0) {
    bVar3 = false;
    do {
      if (*lp == '-') break;
      iVar4 = cmphstr(&lp,"pop",false);
      if (iVar4 != 0) {
        bVar3 = Options::SSyntax::popSyntax();
        if (bVar3) {
          return;
        }
        Warning("[OPT] no previous syntax found",(char *)0x0,W_PASS3);
        return;
      }
      iVar4 = cmphstr(&lp,"push",false);
      if (iVar4 == 0) {
        iVar4 = cmphstr(&lp,"reset",false);
        if (iVar4 == 0) {
          iVar4 = cmphstr(&lp,"listoff",false);
          if (iVar4 == 0) {
            iVar4 = cmphstr(&lp,"liston",false);
            if (iVar4 != 0) {
              DAT_0018d50c = 0;
              goto LAB_00111102;
            }
            iVar4 = cmphstr(&lp,"listall",false);
            if (iVar4 == 0) {
              iVar4 = cmphstr(&lp,"listact",false);
              if (iVar4 == 0) {
                iVar4 = cmphstr(&lp,"listmc",false);
                if (iVar4 == 0) {
                  Error("[OPT] invalid command (valid commands: push, pop, reset, liston, listoff, listall, listact, listmc)"
                        ,lp,PASS3);
                  SkipToEol(&lp);
                  return;
                }
                if ((bVar7 & 1) == 0) {
                  ListFile(false);
                }
                DAT_0018d510 = 2;
              }
              else {
                if ((bVar7 & 1) == 0) {
                  ListFile(false);
                }
                DAT_0018d510 = 1;
              }
            }
            else {
              if ((bVar7 & 1) == 0) {
                ListFile(false);
              }
              DAT_0018d510 = 0;
            }
          }
          else {
            if ((bVar7 & 1) == 0) {
              ListFile(false);
              __stream = (FILE *)GetListingFile();
              if ((__stream != (FILE *)0x0) && (pass == 3)) {
                fputs("# listing file suspended...\n",__stream);
              }
            }
            DAT_0018d50c = 1;
          }
          donotlist = 1;
          bVar7 = 1;
        }
        else {
          Options::SSyntax::resetCurrentSyntax();
          bVar3 = true;
        }
      }
      else {
        if (bVar3) {
          Warning("[OPT] pushing syntax status after reset",(char *)0x0,W_PASS3);
        }
        Options::SSyntax::pushCurrentSyntax();
      }
LAB_00111102:
      iVar4 = SkipBlanks(&lp);
    } while (iVar4 == 0);
  }
  local_858 = (char **)0x0;
  lStack_850 = 0;
  local_848 = 0;
  iVar4 = 0;
  do {
    iVar5 = SkipBlanks(&lp);
    if (iVar5 != 0) {
      uVar6 = lStack_850 - (long)local_858;
      local_860 = (char *)0x0;
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)&local_858,&local_860);
      iVar5 = (int)(uVar6 >> 3);
      iVar4 = Options::parseSyntaxOptions(iVar5,local_858);
      if (iVar4 != iVar5) {
        Error("[OPT] invalid/failed option",local_858[iVar4],PASS3);
      }
      if (DAT_0018d51c != 0) {
        Z80::InitNextExtensions();
      }
      if (local_858 != (char **)0x0) {
        operator_delete(local_858,local_848 - (long)local_858);
      }
      return;
    }
    lVar8 = (long)iVar4;
    local_860 = acStack_838 + lVar8;
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)&local_858,&local_860);
    if (*lp != '\0') {
      do {
        bVar3 = White();
        if (bVar3) break;
        pcVar1 = lp + 1;
        acStack_838[lVar8] = *lp;
        lVar8 = lVar8 + 1;
        pcVar2 = lp + 1;
        lp = pcVar1;
      } while (*pcVar2 != '\0');
      iVar4 = (int)lVar8;
    }
    lVar8 = (long)iVar4;
    iVar4 = iVar4 + 1;
    acStack_838[lVar8] = '\0';
  } while( true );
}

Assistant:

static void dirOPT() {
	// supported options: --zxnext[=cspect] --reversepop --dirbol --nofakes --syntax=<...> -W...
	// process OPT specific command keywords first: {push, pop, reset, listoff, liston, listall, listact, listmc}
	bool didReset = false, didList = Options::syx.IsListingSuspended;
	while (!SkipBlanks(lp) && '-' != *lp) {
		if (cmphstr(lp, "pop")) {	// "pop" previous syntax state
			if (!Options::SSyntax::popSyntax()) Warning("[OPT] no previous syntax found");
			return;
		} else if (cmphstr(lp, "push")) {	// "push" previous syntax state
			if (didReset) Warning("[OPT] pushing syntax status after reset");
			// preserve current syntax status, before using arguments of OPT
			Options::SSyntax::pushCurrentSyntax();
		} else if (cmphstr(lp, "reset")) {	// keep current syntax state
			Options::SSyntax::resetCurrentSyntax();
			didReset = true;
		} else if (cmphstr(lp, "listoff")) {
			if (!didList) {
				ListFile();		// *list* the OPT line suspending the listing
				// show in listing file that some part was suspended
				FILE* listFile = GetListingFile();
				if (LASTPASS == pass && listFile) fputs("# listing file suspended...\n", listFile);
			}
			donotlist = 1;
			Options::syx.IsListingSuspended = didList = true;
		} else if (cmphstr(lp, "liston")) {
			Options::syx.IsListingSuspended = false;
		} else if (cmphstr(lp, "listall")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_ALL;
		} else if (cmphstr(lp, "listact")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_ACTIVE;
		} else if (cmphstr(lp, "listmc")) {
			if (!didList) ListFile();		// *list* the OPT line changing the filtering
			didList = true;
			donotlist = 1;
			Options::syx.ListingType = Options::LST_T_MC_ONLY;
		} else {
			Error("[OPT] invalid command (valid commands: push, pop, reset, liston, listoff, listall, listact, listmc)", lp);
			SkipToEol(lp);
			return;
		}
	}
	// split user arguments into "argc, argv" like variables (by white-space)
	char parsedOpts[LINEMAX];
	std::vector<char*> parsedOptsArray;
	int charI = 0, errI;
	while (!SkipBlanks(lp)) {
		parsedOptsArray.push_back(parsedOpts + charI);
		while (*lp && !White()) parsedOpts[charI++] = *lp++;
		parsedOpts[charI++] = 0;
	}
	int optI = parsedOptsArray.size();
	parsedOptsArray.push_back(nullptr);
	// parse user arguments and adjust current syntax setup
	if (optI != (errI = Options::parseSyntaxOptions(optI, parsedOptsArray.data()))) {
		Error("[OPT] invalid/failed option", parsedOptsArray[errI]);
	}
	// init Z80N extensions if requested (the Init is safe to be called multiple times)
	if (Options::syx.IsNextEnabled) Z80::InitNextExtensions();
}